

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like_optimizations.cpp
# Opt level: O0

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::LikeOptimizationRule::ApplyRule
          (LikeOptimizationRule *this,BoundFunctionExpression *expr,ScalarFunction *function,
          string *pattern,bool is_not_like)

{
  pointer this_00;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> in_RDI;
  string *in_R8;
  byte in_R9B;
  void **in_stack_00000030;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_stack_00000038;
  ScalarFunction *in_stack_00000040;
  LogicalType *in_stack_00000048;
  templated_unique_single_t negation;
  templated_unique_single_t new_function;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *result;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe88;
  Value *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffea0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffea8;
  _Head_base<0UL,_duckdb::Expression_*,_false> args;
  Value *in_stack_fffffffffffffef8;
  string local_100 [8];
  string *in_stack_ffffffffffffff08;
  Value *in_stack_ffffffffffffff10;
  undefined8 local_80;
  undefined8 local_58;
  
  args._M_head_impl =
       (Expression *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0xce0a7f);
  make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType&,duckdb::ScalarFunction,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,decltype(nullptr)>
            (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030);
  ::std::__cxx11::string::begin();
  ::std::__cxx11::string::end();
  ::std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  ::std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  ::std::__cxx11::string::erase(in_R8,local_58,local_80);
  ::std::__cxx11::string::string(local_100,in_R8);
  Value::Value(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  make_uniq<duckdb::BoundConstantExpression,duckdb::Value>(in_stack_fffffffffffffef8);
  unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
  unique_ptr<duckdb::BoundConstantExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffe90,
             (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>_>
              *)in_stack_fffffffffffffe88);
  unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
  ::operator->((unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
                *)in_stack_fffffffffffffe90);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffe90,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffe88);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0xce0c28);
  unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
  ::~unique_ptr((unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                 *)0xce0c35);
  Value::~Value(in_stack_fffffffffffffe90);
  ::std::__cxx11::string::~string(local_100);
  unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
  unique_ptr<duckdb::BoundFunctionExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffe90,
             (unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>_>
              *)in_stack_fffffffffffffe88);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffe90,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffe88);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0xce0c77);
  if ((in_R9B & 1) != 0) {
    make_uniq<duckdb::BoundOperatorExpression,duckdb::ExpressionType,duckdb::LogicalTypeId_const&>
              ((ExpressionType *)args._M_head_impl,(LogicalTypeId *)in_R8);
    this_00 = unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                            *)in_stack_fffffffffffffe90);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::push_back((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)this_00,(value_type *)in_stack_fffffffffffffe88);
    unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
    unique_ptr<duckdb::BoundOperatorExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               this_00,(unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>_>
                        *)in_stack_fffffffffffffe88);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               this_00,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)in_stack_fffffffffffffe88);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               0xce0cf0);
    unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
    ::~unique_ptr((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                   *)0xce0cfa);
  }
  unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
  ::~unique_ptr((unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
                 *)0xce0dd9);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<Expression> LikeOptimizationRule::ApplyRule(BoundFunctionExpression &expr, ScalarFunction function,
                                                       string pattern, bool is_not_like) {
	// replace LIKE by an optimized function
	unique_ptr<Expression> result;
	auto new_function =
	    make_uniq<BoundFunctionExpression>(expr.return_type, std::move(function), std::move(expr.children), nullptr);

	// removing "%" from the pattern
	pattern.erase(std::remove(pattern.begin(), pattern.end(), '%'), pattern.end());

	new_function->children[1] = make_uniq<BoundConstantExpression>(Value(std::move(pattern)));

	result = std::move(new_function);
	if (is_not_like) {
		auto negation = make_uniq<BoundOperatorExpression>(ExpressionType::OPERATOR_NOT, LogicalType::BOOLEAN);
		negation->children.push_back(std::move(result));
		result = std::move(negation);
	}

	return result;
}